

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmp.c
# Opt level: O1

void pmp_update_rule(CPURISCVState_conflict2 *env,uint32_t pmp_index)

{
  uint32_t *puVar1;
  ulong uVar2;
  byte bVar3;
  target_ulong tVar4;
  target_ulong tVar5;
  long lVar6;
  target_ulong tVar7;
  uint uVar8;
  
  (env->pmp_state).num_rules = 0;
  if (pmp_index == 0) {
    tVar4 = 0;
  }
  else {
    tVar4 = (env->pmp_state).pmp[pmp_index - 1].addr_reg << 2;
  }
  uVar2 = (env->pmp_state).pmp[pmp_index].addr_reg;
  uVar8 = (env->pmp_state).pmp[pmp_index].cfg_reg >> 3 & 3;
  tVar5 = (target_ulong)uVar8;
  tVar7 = 0xffffffffffffffff;
  switch(uVar8) {
  case 0:
    break;
  case 1:
    tVar7 = uVar2 * 4 - 1;
    tVar5 = tVar4;
    break;
  case 2:
    tVar7 = uVar2 + 3;
    tVar5 = uVar2 * 4;
    break;
  case 3:
    if (uVar2 == 0xffffffffffffffff) {
      tVar5 = 0;
    }
    else {
      lVar6 = 0;
      if (~uVar2 != 0) {
        for (; (~uVar2 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
        }
      }
      bVar3 = (byte)lVar6;
      lVar6 = (uVar2 >> (bVar3 & 0x3f)) << (bVar3 & 0x3f);
      tVar7 = ((8L << (bVar3 & 0x3f)) + lVar6 * 4) - 1;
      tVar5 = lVar6 << 2;
    }
  }
  (env->pmp_state).addr[pmp_index].sa = tVar5;
  (env->pmp_state).addr[pmp_index].ea = tVar7;
  lVar6 = 0;
  do {
    if (((&(env->pmp_state).pmp[0].cfg_reg)[lVar6] & 0x18) != 0) {
      puVar1 = &(env->pmp_state).num_rules;
      *puVar1 = *puVar1 + 1;
    }
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x100);
  return;
}

Assistant:

static void pmp_update_rule(CPURISCVState *env, uint32_t pmp_index)
{
    int i;

    env->pmp_state.num_rules = 0;

    uint8_t this_cfg = env->pmp_state.pmp[pmp_index].cfg_reg;
    target_ulong this_addr = env->pmp_state.pmp[pmp_index].addr_reg;
    target_ulong prev_addr = 0u;
    target_ulong sa = 0u;
    target_ulong ea = 0u;

    if (pmp_index >= 1u) {
        prev_addr = env->pmp_state.pmp[pmp_index - 1].addr_reg;
    }

    switch (pmp_get_a_field(this_cfg)) {
    case PMP_AMATCH_OFF:
        sa = 0u;
        ea = -1;
        break;

    case PMP_AMATCH_TOR:
        sa = prev_addr << 2; /* shift up from [xx:0] to [xx+2:2] */
        ea = (this_addr << 2) - 1u;
        break;

    case PMP_AMATCH_NA4:
        sa = this_addr << 2; /* shift up from [xx:0] to [xx+2:2] */
        ea = (this_addr + 4u) - 1u;
        break;

    case PMP_AMATCH_NAPOT:
        pmp_decode_napot(this_addr, &sa, &ea);
        break;

    default:
        sa = 0u;
        ea = 0u;
        break;
    }

    env->pmp_state.addr[pmp_index].sa = sa;
    env->pmp_state.addr[pmp_index].ea = ea;

    for (i = 0; i < MAX_RISCV_PMPS; i++) {
        const uint8_t a_field =
            pmp_get_a_field(env->pmp_state.pmp[i].cfg_reg);
        if (PMP_AMATCH_OFF != a_field) {
            env->pmp_state.num_rules++;
        }
    }
}